

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::compiler::Compiler::Node::Content_&> __thiscall
capnp::compiler::Compiler::Node::getContent(Node *this,State minimumState)

{
  void **ppvVar1;
  void *pvVar2;
  void **ppvVar3;
  char *pcVar4;
  Arena *pAVar5;
  ushort uVar6;
  int iVar7;
  _func_int **pp_Var8;
  Module *pMVar9;
  void *pvVar10;
  _func_int **pp_Var11;
  long *plVar12;
  WirePointer *pWVar13;
  undefined8 uVar14;
  uint64_t uVar15;
  StringPtr value;
  Reader *pRVar16;
  char cVar17;
  uint uVar18;
  Node *this_00;
  undefined8 *puVar19;
  Node *pNVar20;
  NodeTranslator *pNVar22;
  Schema SVar23;
  undefined1 *ptr;
  int in_EDX;
  long lVar24;
  undefined4 in_register_00000034;
  CompiledModule *parent;
  size_t sVar25;
  void *pvVar26;
  ulong uVar27;
  ElementCount EVar29;
  Reader *auxNode;
  Reader *pRVar30;
  Alias *ptrCopy;
  long *plVar31;
  bool bVar32;
  ArrayPtr<const_char> AVar33;
  Reader value_00;
  NodeSet local_5f8;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
  *local_590;
  void **local_588;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
  *local_580;
  BuilderFor<capnp::schema::Node> builder;
  OrphanBuilder local_548;
  Fault f_1;
  undefined8 uStack_520;
  WirePointer *local_518;
  Node *pNStack_510;
  StructDataBitCount local_508;
  StructPointerCount SStack_504;
  undefined2 uStack_502;
  int iStack_500;
  undefined4 uStack_4fc;
  DebugExpression<bool> _kjCondition;
  undefined3 uStack_397;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  WirePointer *local_388;
  int iStack_380;
  undefined4 uStack_37c;
  uint local_378;
  ushort uStack_374;
  undefined2 uStack_372;
  int iStack_370;
  undefined4 uStack_36c;
  WirePointer *local_368;
  size_t local_360;
  ArrayDisposer *local_358;
  Reader *local_350;
  char *local_348;
  ArrayDisposer *local_340;
  Fault f;
  undefined8 uStack_1f0;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  ElementCount local_1e0;
  StructPointerCount SStack_1d4;
  Builder nestedNodes;
  void *pvVar21;
  ulong uVar28;
  
  parent = (CompiledModule *)CONCAT44(in_register_00000034,minimumState);
  cVar17 = *(char *)((parent->contentArena).super_MessageBuilder.arenaSpace + 10);
  __kjCondition = CONCAT31(uStack_397,cVar17) ^ 1;
  if (cVar17 != '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[45]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x1ce,FAILED,"!isBuiltin",
               "_kjCondition,\"illegal method call for built-in declaration\"",&_kjCondition,
               (char (*) [45])"illegal method call for built-in declaration");
    kj::_::Debug::Fault::fatal(&f);
  }
  ppvVar1 = (parent->contentArena).super_MessageBuilder.arenaSpace + 0xc;
  iVar7 = *(int *)((parent->contentArena).super_MessageBuilder.arenaSpace + 0xc);
  if (in_EDX <= iVar7) {
    (this->super_Resolver)._vptr_Resolver = (_func_int **)ppvVar1;
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)this;
  }
  if ((char)(parent->rootNode).kind == USING) {
    pp_Var8 = parent->parserModule[1].super_ErrorReporter._vptr_ErrorReporter;
    (**(code **)*pp_Var8)
              (pp_Var8,*(undefined4 *)
                        ((long)(parent->contentArena).super_MessageBuilder.arenaSpace + 0x54),
               *(undefined4 *)((parent->contentArena).super_MessageBuilder.arenaSpace + 0xb),
               "Declaration recursively depends on itself.",0x2b);
    (this->super_Resolver)._vptr_Resolver = (_func_int **)0x0;
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)this;
  }
  *(undefined1 *)&(parent->rootNode).kind = USING;
  if (iVar7 != 2) {
    if (iVar7 != 1) {
      if ((iVar7 != 0) || (in_EDX < 1)) goto LAB_0011714a;
      bVar32 = *(ushort *)((long)(parent->contentArena).super_MessageBuilder.arenaSpace + 0x24) < 3;
      local_388 = (WirePointer *)
                  ((long)(parent->contentArena).super_MessageBuilder.arenaSpace[3] + 0x10);
      if (bVar32) {
        local_388 = (WirePointer *)0x0;
      }
      iStack_380 = *(int *)((parent->contentArena).super_MessageBuilder.arenaSpace + 5);
      if (bVar32) {
        __kjCondition = 0;
        uStack_394 = 0;
        uStack_390 = 0;
        uStack_38c = 0;
        iStack_380 = 0x7fffffff;
      }
      else {
        __kjCondition = *(uint *)(parent->contentArena).super_MessageBuilder.arenaSpace;
        uStack_394 = *(undefined4 *)
                      ((long)(parent->contentArena).super_MessageBuilder.arenaSpace + 4);
        uStack_390 = *(undefined4 *)((parent->contentArena).super_MessageBuilder.arenaSpace + 1);
        uStack_38c = *(undefined4 *)
                      ((long)(parent->contentArena).super_MessageBuilder.arenaSpace + 0xc);
      }
      pp_Var8 = (parent->parserModule->super_ErrorReporter)._vptr_ErrorReporter;
      capnp::_::PointerReader::getList
                ((ListReader *)&f,(PointerReader *)&_kjCondition,INLINE_COMPOSITE,(word *)0x0);
      if (local_1e0 != 0) {
        pAVar5 = (Arena *)(pp_Var8 + 2);
        local_590 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
                     *)&(parent->contentArena).allocationStrategy;
        local_588 = (parent->contentArena).super_MessageBuilder.arenaSpace + 0x13;
        local_580 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
                     *)((parent->contentArena).super_MessageBuilder.arenaSpace + 0xd);
        EVar29 = 0;
        do {
          pNVar20 = (Node *)0x0;
          capnp::_::ListReader::getStructElement
                    ((StructReader *)&_kjCondition,(ListReader *)&f,EVar29);
          if (local_378 < 0x20) {
LAB_00116750:
            this_00 = (Node *)kj::Arena::allocateBytes(pAVar5,0x1c0,8,false);
            Node(this_00,(Node *)parent,(Reader *)&_kjCondition);
            local_5f8.node._reader.pointers._0_4_ = iStack_370;
            local_5f8.node._reader.data = (Node *)CONCAT44(uStack_37c,iStack_380);
            if (uStack_374 == 0) {
              local_5f8.node._reader.pointers._0_4_ = 0x7fffffff;
              local_5f8.node._reader.data = pNVar20;
            }
            local_5f8.node._reader.segment._0_4_ = 0;
            local_5f8.node._reader.segment._4_4_ = 0;
            local_5f8.node._reader.capTable._0_4_ = 0;
            local_5f8.node._reader.capTable._4_4_ = 0;
            if (uStack_374 != 0) {
              local_5f8.node._reader.segment._0_4_ = __kjCondition;
              local_5f8.node._reader.segment._4_4_ = uStack_394;
              local_5f8.node._reader.capTable._0_4_ = uStack_390;
              local_5f8.node._reader.capTable._4_4_ = uStack_38c;
            }
            capnp::_::PointerReader::getStruct
                      ((StructReader *)&f_1,(PointerReader *)&local_5f8,(word *)0x0);
            local_5f8.node._reader.pointers._0_4_ = iStack_500;
            local_5f8.node._reader.data = pNStack_510;
            if (SStack_504 == 0) {
              local_5f8.node._reader.pointers._0_4_ = 0x7fffffff;
              local_5f8.node._reader.data = pNVar20;
            }
            local_5f8.node._reader.segment._0_4_ = 0;
            local_5f8.node._reader.segment._4_4_ = 0;
            local_5f8.node._reader.capTable._0_4_ = 0;
            local_5f8.node._reader.capTable._4_4_ = 0;
            if (SStack_504 != 0) {
              local_5f8.node._reader.segment._0_4_ = (uint)f_1.exception;
              local_5f8.node._reader.segment._4_4_ = f_1.exception._4_4_;
              local_5f8.node._reader.capTable._0_4_ = (undefined4)uStack_520;
              local_5f8.node._reader.capTable._4_4_ = uStack_520._4_4_;
            }
            AVar33 = (ArrayPtr<const_char>)
                     capnp::_::PointerReader::getBlob<capnp::Text>
                               ((PointerReader *)&local_5f8,(void *)0x0,0);
            puVar19 = (undefined8 *)(parent->contentArena).super_MessageBuilder.arenaSpace[0x14];
            if (puVar19 ==
                (undefined8 *)(parent->contentArena).super_MessageBuilder.arenaSpace[0x15]) {
              sVar25 = (long)puVar19 - (long)*local_588 >> 2;
              if (puVar19 == (undefined8 *)*local_588) {
                sVar25 = 4;
              }
              kj::Vector<capnp::compiler::Compiler::Node_*>::setCapacity
                        ((Vector<capnp::compiler::Compiler::Node_*> *)local_588,sVar25);
              puVar19 = (undefined8 *)(parent->contentArena).super_MessageBuilder.arenaSpace[0x14];
            }
            *puVar19 = this_00;
            ppvVar3 = (parent->contentArena).super_MessageBuilder.arenaSpace + 0x14;
            *ppvVar3 = (void *)((long)*ppvVar3 + 8);
            local_518 = (WirePointer *)
                        &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance;
            _f_1 = AVar33;
            std::
            _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
            ::
            _M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>
                      (local_580,
                       (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>
                        *)&f_1);
            pNStack_510 = this_00;
            if (this_00 != (Node *)0x0) {
              pNStack_510 = (Node *)0x0;
              kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::disposeImpl
                        ((DestructorOnlyDisposer<capnp::compiler::Compiler::Node> *)
                         &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance,
                         (this_00->super_Resolver)._vptr_Resolver[-2] +
                         (long)&(this_00->super_Resolver)._vptr_Resolver);
            }
          }
          else {
            uVar6 = *(ushort *)((long)&(local_388->offsetAndKind).value + 2);
            if (0xd < uVar6) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,char_const(&)[25],capnp::compiler::Declaration::Reader&>
                        (&f_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                         ,0x205,FAILED,(char *)0x0,"\"unknown declaration type\", nestedDecl",
                         (char (*) [25])"unknown declaration type",(Reader *)&_kjCondition);
              kj::_::Debug::Fault::fatal(&f_1);
            }
            if ((0x35d0U >> (uVar6 & 0x1f) & 1) == 0) {
              if ((0xa2dU >> (uVar6 & 0x1f) & 1) != 0) goto LAB_00116750;
              local_5f8.node._reader.data = (void *)(CONCAT44(uStack_37c,iStack_380) + 0x28);
              local_5f8.node._reader.segment._0_4_ = __kjCondition;
              local_5f8.node._reader.segment._4_4_ = uStack_394;
              local_5f8.node._reader.capTable._0_4_ = uStack_390;
              local_5f8.node._reader.capTable._4_4_ = uStack_38c;
              local_5f8.node._reader.pointers._0_4_ = iStack_370;
              if (uStack_374 < 6) {
                local_5f8.node._reader.segment._0_4_ = 0;
                local_5f8.node._reader.segment._4_4_ = 0;
                local_5f8.node._reader.capTable._0_4_ = 0;
                local_5f8.node._reader.capTable._4_4_ = 0;
                local_5f8.node._reader.pointers._0_4_ = 0x7fffffff;
                local_5f8.node._reader.data = pNVar20;
              }
              pMVar9 = parent->parserModule;
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&f_1,(PointerReader *)&local_5f8,(word *)0x0);
              pNVar20 = (Node *)kj::Arena::allocateBytes(pAVar5,0xd8,8,false);
              (pNVar20->super_Resolver)._vptr_Resolver = (_func_int **)pMVar9;
              pNVar20->module = parent;
              (pNVar20->parent).ptr = (Node *)f_1.exception;
              (pNVar20->declaration)._reader.segment = uStack_520;
              (pNVar20->declaration)._reader.capTable = (CapTableReader *)local_518;
              (pNVar20->declaration)._reader.data = pNStack_510;
              (pNVar20->declaration)._reader.pointers =
                   (WirePointer *)CONCAT26(uStack_502,CONCAT24(SStack_504,local_508));
              (pNVar20->declaration)._reader.dataSize = iStack_500;
              (pNVar20->declaration)._reader.pointerCount = (short)uStack_4fc;
              *(short *)&(pNVar20->declaration)._reader.field_0x26 = SUB42(uStack_4fc,2);
              *(undefined1 *)&(pNVar20->declaration)._reader.nestingLimit = 0;
              (pNVar20->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
              (pNVar20->guardedContent).orderedNestedNodes.builder.pos =
                   (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
              (pNVar20->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
              (pNVar20->guardedContent).orderedNestedNodes.builder.disposer = (ArrayDisposer *)0x0;
              *(undefined1 *)&(pNVar20->guardedContent).aliases._M_t._M_impl = 0;
              local_5f8.node._reader.data = (void *)CONCAT44(uStack_37c,iStack_380);
              local_5f8.node._reader.segment._0_4_ = __kjCondition;
              local_5f8.node._reader.segment._4_4_ = uStack_394;
              local_5f8.node._reader.capTable._0_4_ = uStack_390;
              local_5f8.node._reader.capTable._4_4_ = uStack_38c;
              local_5f8.node._reader.pointers._0_4_ = iStack_370;
              if (uStack_374 == 0) {
                local_5f8.node._reader.segment._0_4_ = 0;
                local_5f8.node._reader.segment._4_4_ = 0;
                local_5f8.node._reader.capTable._0_4_ = 0;
                local_5f8.node._reader.capTable._4_4_ = 0;
                local_5f8.node._reader.pointers._0_4_ = 0x7fffffff;
                local_5f8.node._reader.data = (void *)0x0;
              }
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&f_1,(PointerReader *)&local_5f8,(word *)0x0);
              local_5f8.node._reader.pointers._0_4_ = iStack_500;
              local_5f8.node._reader.data = pNStack_510;
              if (SStack_504 == 0) {
                local_5f8.node._reader.data = (Node *)0x0;
                local_5f8.node._reader.pointers._0_4_ = 0x7fffffff;
              }
              local_5f8.node._reader.segment._0_4_ = 0;
              local_5f8.node._reader.segment._4_4_ = 0;
              local_5f8.node._reader.capTable._0_4_ = 0;
              local_5f8.node._reader.capTable._4_4_ = 0;
              if (SStack_504 != 0) {
                local_5f8.node._reader.segment._0_4_ = (uint)f_1.exception;
                local_5f8.node._reader.segment._4_4_ = f_1.exception._4_4_;
                local_5f8.node._reader.capTable._0_4_ = (undefined4)uStack_520;
                local_5f8.node._reader.capTable._4_4_ = uStack_520._4_4_;
              }
              _f_1 = (ArrayPtr<const_char>)
                     capnp::_::PointerReader::getBlob<capnp::Text>
                               ((PointerReader *)&local_5f8,(void *)0x0,0);
              local_518 = (WirePointer *)
                          &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::instance;
              std::
              _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
              ::
              _M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>
                        (local_590,
                         (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>
                          *)&f_1);
              pNStack_510 = pNVar20;
              if (pNVar20 != (Node *)0x0) {
                pNStack_510 = (Node *)0x0;
                kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::disposeImpl
                          ((DestructorOnlyDisposer<capnp::compiler::Compiler::Alias> *)
                           &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::instance,
                           pNVar20);
              }
            }
          }
          EVar29 = EVar29 + 1;
        } while (local_1e0 != EVar29);
      }
      *(undefined4 *)ppvVar1 = 1;
    }
    if (in_EDX < 2) goto LAB_0011714a;
    pp_Var8 = (parent->parserModule->super_ErrorReporter)._vptr_ErrorReporter;
    capnp::_::OrphanBuilder::initStruct
              ((OrphanBuilder *)&f,(BuilderArena *)pp_Var8[0x2b],(CapTableBuilder *)pp_Var8[0x2c],
               (StructSize)0x60006);
    local_548.segment = uStack_1f0;
    local_548.tag.content = (uint64_t)f.exception;
    capnp::_::OrphanBuilder::asStruct(&builder._builder,&local_548,(StructSize)0x60006);
    *(void **)builder._builder.data = (parent->contentArena).super_MessageBuilder.arenaSpace[6];
    value.content.ptr = (char *)(parent->contentArena).super_MessageBuilder.arenaSpace[7];
    value.content.size_ = (size_t)(parent->contentArena).super_MessageBuilder.arenaSpace[8];
    f.exception = (Exception *)builder._builder.segment;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&f,(Reader)value.content);
    pvVar10 = (parent->contentArena).super_MessageBuilder.arenaSpace[7];
    pvVar21 = (parent->contentArena).super_MessageBuilder.arenaSpace[8];
    uVar28 = (long)pvVar21 - 1;
    pvVar26 = pvVar21;
    do {
      if (pvVar26 == (void *)0x1) goto LAB_00116bbc;
      pvVar2 = (void *)((long)pvVar26 + -1);
      pcVar4 = (char *)((long)pvVar10 + -2 + (long)pvVar26);
      pvVar26 = pvVar2;
    } while (*pcVar4 != '.');
    *(int *)((long)builder._builder.data + 8) = (int)pvVar2;
LAB_00116bbc:
    do {
      uVar27 = uVar28 - 1;
      if (uVar28 == 0) goto LAB_00116be1;
      uVar18 = (int)pvVar21 - 1;
      pvVar21 = (void *)(ulong)uVar18;
      lVar24 = uVar28 - 1;
      uVar28 = uVar27;
    } while (*(char *)((long)pvVar10 + lVar24) != ':');
    if (*(uint *)((long)builder._builder.data + 8) < uVar27) {
      *(uint *)((long)builder._builder.data + 8) = uVar18;
    }
LAB_00116be1:
    pp_Var11 = (parent->contentArena).super_MessageBuilder._vptr_MessageBuilder;
    if (pp_Var11 != (_func_int **)0x0) {
      *(_func_int **)((long)builder._builder.data + 0x10) = pp_Var11[9];
    }
    f.exception = (Exception *)builder._builder.segment;
    capnp::_::PointerBuilder::initStructList
              (&nestedNodes.builder,(PointerBuilder *)&f,
               (ElementCount)
               ((ulong)((long)(parent->contentArena).super_MessageBuilder.arenaSpace[0x14] -
                       (long)(parent->contentArena).super_MessageBuilder.arenaSpace[0x13]) >> 3),
               (StructSize)0x10001);
    plVar31 = (long *)(parent->contentArena).super_MessageBuilder.arenaSpace[0x13];
    plVar12 = (long *)(parent->contentArena).super_MessageBuilder.arenaSpace[0x14];
    if (plVar31 != plVar12) {
      EVar29 = 0;
      do {
        lVar24 = *plVar31;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&_kjCondition,&nestedNodes.builder,EVar29);
        if (*(short *)(lVar24 + 0x3c) == 0) {
          f_1.exception._0_4_ = 0;
          f_1.exception._4_4_ = 0;
          uStack_520._0_4_ = 0;
          uStack_520._4_4_ = 0;
        }
        else {
          f_1.exception._0_4_ = *(undefined4 *)(lVar24 + 0x18);
          f_1.exception._4_4_ = *(undefined4 *)(lVar24 + 0x1c);
          uStack_520._0_4_ = *(undefined4 *)(lVar24 + 0x20);
          uStack_520._4_4_ = *(undefined4 *)(lVar24 + 0x24);
        }
        capnp::_::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&f_1,(word *)0x0);
        uStack_1f0._0_4_ = 0;
        uStack_1f0._4_4_ = 0;
        f_1.exception._0_4_ = 0;
        f_1.exception._4_4_ = 0;
        if (SStack_1d4 != 0) {
          uStack_1f0._0_4_ = SUB84(builder._builder.capTable,0);
          uStack_1f0._4_4_ = (undefined4)((ulong)builder._builder.capTable >> 0x20);
          f_1.exception._0_4_ = f.exception._0_4_;
          f_1.exception._4_4_ = f.exception._4_4_;
        }
        uStack_520._0_4_ = (undefined4)uStack_1f0;
        uStack_520._4_4_ = uStack_1f0._4_4_;
        value_00 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&f_1,(void *)0x0,0);
        f_1.exception._4_4_ = uStack_394;
        f_1.exception._0_4_ = __kjCondition;
        uStack_520._4_4_ = uStack_38c;
        uStack_520._0_4_ = uStack_390;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&f_1,value_00);
        capnp::_::ListBuilder::getStructElement((StructBuilder *)&f,&nestedNodes.builder,EVar29);
        builder._builder.pointers[1] = *(WirePointer *)(lVar24 + 0x48);
        EVar29 = EVar29 + 1;
        plVar31 = plVar31 + 1;
      } while (plVar31 != plVar12);
    }
    pAVar5 = (Arena *)(pp_Var8 + 0x2d);
    f.exception._0_1_ =
         *(int *)((parent->parserModule->super_ErrorReporter)._vptr_ErrorReporter + 1) == 0;
    pNVar22 = kj::Arena::
              allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
                        (pAVar5,(Node *)parent,
                         (ErrorReporter *)
                         parent->parserModule[1].super_ErrorReporter._vptr_ErrorReporter,
                         (Reader *)(parent->contentArena).super_MessageBuilder.arenaSpace,
                         (Orphan<capnp::schema::Node> *)&local_548,(bool *)&f);
    (parent->content).builder.tag.content = (uint64_t)pNVar22;
    NodeTranslator::getBootstrapNode(&local_5f8,pNVar22);
    if (local_5f8.auxNodes.size_ != 0) {
      lVar24 = local_5f8.auxNodes.size_ * 0x30;
      pRVar30 = local_5f8.auxNodes.ptr;
      do {
        SchemaLoader::loadOnce((SchemaLoader *)(pp_Var8 + 0x31),pRVar30);
        pRVar30 = pRVar30 + 1;
        lVar24 = lVar24 + -0x30;
      } while (lVar24 != 0);
    }
    SVar23 = SchemaLoader::loadOnce((SchemaLoader *)(pp_Var8 + 0x31),&local_5f8.node);
    sVar25 = local_5f8.sourceInfo.size_;
    pRVar16 = local_5f8.sourceInfo.ptr;
    (parent->content).builder.capTable = (CapTableBuilder *)SVar23.raw;
    *(undefined1 *)&(parent->content).builder.segment = 1;
    if (local_5f8.sourceInfo.ptr != (Reader *)0x0) {
      local_5f8.sourceInfo.ptr = (Reader *)0x0;
      local_5f8.sourceInfo.size_ = 0;
      (*(code *)**(undefined8 **)local_5f8.sourceInfo.disposer)
                (local_5f8.sourceInfo.disposer,pRVar16,0x30,sVar25,sVar25,0);
    }
    sVar25 = local_5f8.auxNodes.size_;
    pRVar30 = local_5f8.auxNodes.ptr;
    if (local_5f8.auxNodes.ptr != (Reader *)0x0) {
      local_5f8.auxNodes.ptr = (Reader *)0x0;
      local_5f8.auxNodes.size_ = 0;
      (*(code *)**(undefined8 **)local_5f8.auxNodes.disposer)
                (local_5f8.auxNodes.disposer,pRVar30,0x30,sVar25,sVar25,0);
    }
    f.exception = f.exception & 0xffffffffffffff00;
    ptr = (undefined1 *)kj::Arena::allocateBytes(pAVar5,0x10,8,true);
    *ptr = 1;
    *(void ***)(ptr + 8) = ppvVar1;
    kj::Arena::setDestructor
              (pAVar5,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
              );
    *(undefined4 *)ppvVar1 = 2;
    if (local_548.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(&local_548);
    }
  }
  if (2 < in_EDX) {
    f.exception = (Exception *)0x0;
    if (*(char *)&(parent->content).builder.segment == '\0') {
      cVar17 = (**(code **)(*parent->parserModule[1].super_ErrorReporter._vptr_ErrorReporter + 8))()
      ;
      f_1.exception._0_1_ = cVar17;
      if (cVar17 == '\0') {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                   ,0x253,FAILED,"module->getErrorReporter().hadErrors()","_kjCondition,",
                   (DebugExpression<bool> *)&f_1);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      NodeTranslator::getBootstrapNode
                ((NodeSet *)&_kjCondition,(NodeTranslator *)(parent->content).builder.tag.content);
    }
    else {
      pNVar22 = (NodeTranslator *)(parent->content).builder.tag.content;
      SVar23 = SchemaLoader::getUnbound
                         ((SchemaLoader *)
                          ((parent->parserModule->super_ErrorReporter)._vptr_ErrorReporter + 0x31),
                          (uint64_t)(parent->contentArena).super_MessageBuilder.arenaSpace[6]);
      NodeTranslator::finish((NodeSet *)&_kjCondition,pNVar22,SVar23);
    }
    f.exception = (Exception *)CONCAT44(uStack_394,__kjCondition);
    if (*(char *)&(parent->content).builder.location == '\x01') {
      *(undefined1 *)&(parent->content).builder.location = 0;
    }
    uStack_1e8 = SUB84(local_388,0);
    uStack_1e4 = (undefined4)((ulong)local_388 >> 0x20);
    *(uint *)&(parent->rootNode).declaration._reader.capTable = local_378;
    *(uint *)((long)&(parent->rootNode).declaration._reader.capTable + 4) =
         CONCAT22(uStack_372,uStack_374);
    *(int *)&(parent->rootNode).declaration._reader.data = iStack_370;
    *(undefined4 *)((long)&(parent->rootNode).declaration._reader.data + 4) = uStack_36c;
    *(undefined4 *)&(parent->rootNode).parent.ptr = uStack_1e8;
    *(undefined4 *)((long)&(parent->rootNode).parent.ptr + 4) = uStack_1e4;
    *(int *)&(parent->rootNode).declaration._reader.segment = iStack_380;
    *(undefined4 *)((long)&(parent->rootNode).declaration._reader.segment + 4) = uStack_37c;
    (parent->rootNode).super_Resolver._vptr_Resolver = (_func_int **)f.exception;
    (parent->rootNode).module = (CompiledModule *)CONCAT44(uStack_38c,uStack_390);
    *(undefined1 *)&(parent->content).builder.location = 1;
    pWVar13 = (parent->rootNode).declaration._reader.pointers;
    if (pWVar13 != (WirePointer *)0x0) {
      uVar14._0_4_ = (parent->rootNode).declaration._reader.dataSize;
      uVar14._4_2_ = (parent->rootNode).declaration._reader.pointerCount;
      uVar14._6_2_ = *(undefined2 *)&(parent->rootNode).declaration._reader.field_0x26;
      (parent->rootNode).declaration._reader.pointers = (WirePointer *)0x0;
      (parent->rootNode).declaration._reader.dataSize = 0;
      (parent->rootNode).declaration._reader.pointerCount = 0;
      *(undefined2 *)&(parent->rootNode).declaration._reader.field_0x26 = 0;
      puVar19 = *(undefined8 **)&(parent->rootNode).declaration._reader.nestingLimit;
      (**(code **)*puVar19)(puVar19,pWVar13,0x30,uVar14,uVar14,0);
    }
    (parent->rootNode).declaration._reader.pointers = local_368;
    (parent->rootNode).declaration._reader.dataSize = (undefined4)local_360;
    (parent->rootNode).declaration._reader.pointerCount = local_360._4_2_;
    *(undefined2 *)&(parent->rootNode).declaration._reader.field_0x26 = local_360._6_2_;
    *(ArrayDisposer **)&(parent->rootNode).declaration._reader.nestingLimit = local_358;
    uVar15 = (parent->rootNode).id;
    if (uVar15 != 0) {
      pcVar4 = (parent->rootNode).displayName.content.ptr;
      (parent->rootNode).id = 0;
      (parent->rootNode).displayName.content.ptr = (char *)0x0;
      puVar19 = (undefined8 *)(parent->rootNode).displayName.content.size_;
      (**(code **)*puVar19)(puVar19,uVar15,0x30,pcVar4,pcVar4,0);
    }
    (parent->rootNode).id = (uint64_t)local_350;
    (parent->rootNode).displayName.content.ptr = local_348;
    (parent->rootNode).displayName.content.size_ = (size_t)local_340;
    *(undefined4 *)((parent->contentArena).super_MessageBuilder.arenaSpace + 0xc) = 3;
  }
LAB_0011714a:
  (this->super_Resolver)._vptr_Resolver = (_func_int **)ppvVar1;
  *(undefined1 *)&(parent->rootNode).kind = FILE;
  return (Maybe<capnp::compiler::Compiler::Node::Content_&>)this;
}

Assistant:

kj::Maybe<Compiler::Node::Content&> Compiler::Node::getContent(Content::State minimumState) {
  KJ_REQUIRE(!isBuiltin, "illegal method call for built-in declaration");

  auto& content = guardedContent;

  if (content.stateHasReached(minimumState)) {
    return content;
  }

  if (inGetContent) {
    addError("Declaration recursively depends on itself.");
    return kj::none;
  }

  inGetContent = true;
  KJ_DEFER(inGetContent = false);

  switch (content.state) {
    case Content::STUB: {
      if (minimumState <= Content::STUB) break;

      // Expand the child nodes.
      auto& arena = module->getCompiler().getNodeArena();

      for (auto nestedDecl: declaration.getNestedDecls()) {
        switch (nestedDecl.which()) {
          case Declaration::FILE:
          case Declaration::CONST:
          case Declaration::ANNOTATION:
          case Declaration::ENUM:
          case Declaration::STRUCT:
          case Declaration::INTERFACE: {
            kj::Own<Node> subNode = arena.allocateOwn<Node>(*this, nestedDecl);
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.orderedNestedNodes.add(subNode);
            content.nestedNodes.insert(std::make_pair(name, kj::mv(subNode)));
            break;
          }

          case Declaration::USING: {
            kj::Own<Alias> alias = arena.allocateOwn<Alias>(
                *module, *this, nestedDecl.getUsing().getTarget());
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.aliases.insert(std::make_pair(name, kj::mv(alias)));
            break;
          }
          case Declaration::ENUMERANT:
          case Declaration::FIELD:
          case Declaration::UNION:
          case Declaration::GROUP:
          case Declaration::METHOD:
          case Declaration::NAKED_ID:
          case Declaration::NAKED_ANNOTATION:
            // Not a node.  Skip.
            break;
          default:
            KJ_FAIL_ASSERT("unknown declaration type", nestedDecl);
            break;
        }
      }

      content.advanceState(Content::EXPANDED);
    } KJ_FALLTHROUGH;

    case Content::EXPANDED: {
      if (minimumState <= Content::EXPANDED) break;

      // Construct the NodeTranslator.
      auto& workspace = module->getCompiler().getWorkspace();

      auto schemaNode = workspace.orphanage.newOrphan<schema::Node>();
      auto builder = schemaNode.get();
      builder.setId(id);
      builder.setDisplayName(displayName);
      // TODO(cleanup):  Would be better if we could remember the prefix length from before we
      //   added this decl's name to the end.
      KJ_IF_SOME(lastDot, displayName.findLast('.')) {
        builder.setDisplayNamePrefixLength(lastDot + 1);
      }
      KJ_IF_SOME(lastColon, displayName.findLast(':')) {
        if (lastColon > builder.getDisplayNamePrefixLength()) {
          builder.setDisplayNamePrefixLength(lastColon + 1);
        }
      }
      KJ_IF_SOME(p, parent) {
        builder.setScopeId(p.id);
      }

      auto nestedNodes = builder.initNestedNodes(content.orderedNestedNodes.size());
      auto nestedIter = nestedNodes.begin();
      for (auto node: content.orderedNestedNodes) {
        nestedIter->setName(node->declaration.getName().getValue());
        nestedIter->setId(node->id);
        ++nestedIter;
      }

      content.translator = &workspace.arena.allocate<NodeTranslator>(
          *this, module->getErrorReporter(), declaration, kj::mv(schemaNode),
          module->getCompiler().shouldCompileAnnotations());
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
        auto nodeSet = content.translator->getBootstrapNode();
        for (auto& auxNode: nodeSet.auxNodes) {
          workspace.bootstrapLoader.loadOnce(auxNode);
        }
        content.bootstrapSchema = workspace.bootstrapLoader.loadOnce(nodeSet.node);
      })) {
        content.bootstrapSchema = kj::none;
        // Only bother to report validation failures if we think we haven't seen any errors.
        // Otherwise we assume that the errors caused the validation failure.
        if (!module->getErrorReporter().hadErrors()) {
          addError(kj::str("Internal compiler bug: Bootstrap schema failed validation:\n",
                           exception));
        }
      }

      // If the Workspace is destroyed, revert the node to the EXPANDED state, because the
      // NodeTranslator is no longer valid in this case.
      workspace.arena.copy(kj::defer([&content]() {
        content.bootstrapSchema = kj::none;
        if (content.state > Content::EXPANDED) {
          content.state = Content::EXPANDED;
        }
      }));

      content.advanceState(Content::BOOTSTRAP);
    } KJ_FALLTHROUGH;

    case Content::BOOTSTRAP: {
      if (minimumState <= Content::BOOTSTRAP) break;

      // Create the final schema.
      NodeTranslator::NodeSet nodeSet;
      if (content.bootstrapSchema == kj::none) {
        // Must have failed in an earlier stage.
        KJ_ASSERT(module->getErrorReporter().hadErrors());
        nodeSet = content.translator->getBootstrapNode();
      } else {
        nodeSet = content.translator->finish(
            module->getCompiler().getWorkspace().bootstrapLoader.getUnbound(id));
      }

      content.finalSchema = nodeSet.node;
      content.auxSchemas = kj::mv(nodeSet.auxNodes);
      content.sourceInfo = kj::mv(nodeSet.sourceInfo);

      content.advanceState(Content::FINISHED);
    } KJ_FALLTHROUGH;

    case Content::FINISHED:
      break;
  }

  return content;
}